

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFederateExport.cpp
# Opt level: O0

void helicsMessageResize(HelicsMessage message,int newSize,HelicsError *err)

{
  Message *pMVar1;
  Message *mess;
  size_t in_stack_ffffffffffffffc8;
  SmallBuffer *in_stack_ffffffffffffffd0;
  HelicsMessage in_stack_ffffffffffffffd8;
  
  pMVar1 = getMessageObj(in_stack_ffffffffffffffd8,(HelicsError *)in_stack_ffffffffffffffd0);
  if (pMVar1 != (Message *)0x0) {
    helics::SmallBuffer::resize(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  }
  return;
}

Assistant:

void helicsMessageResize(HelicsMessage message, int newSize, HelicsError* err)
{
    auto* mess = getMessageObj(message, err);
    if (mess == nullptr) {
        return;
    }
    try {
        mess->data.resize(newSize);
    }
    catch (...) {
        helicsErrorHandler(err);
    }
}